

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
* google::protobuf::compiler::cpp::anon_unknown_60::Sorted<google::protobuf::FileDescriptor>
            (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *__return_storage_ptr__,
            unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *vals)

{
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  __last;
  long lVar1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *extraout_RAX;
  ulong uVar2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *extraout_RAX_00;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *pvVar3;
  allocator_type local_19;
  
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::
  vector<std::__detail::_Node_const_iterator<google::protobuf::FileDescriptor_const*,true,false>,void>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)__return_storage_ptr__,
             (_Node_const_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>)vals,
             (_Node_const_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>)0x0,
             &local_19);
  __first._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = extraout_RAX;
  if (__first._M_current != __last._M_current) {
    uVar2 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const**,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*)>
                )0x298805);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const**,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*)>
                )0x298805);
    pvVar3 = extraout_RAX_00;
  }
  return pvVar3;
}

Assistant:

std::vector<const T*> Sorted(const std::unordered_set<const T*>& vals) {
  std::vector<const T*> sorted(vals.begin(), vals.end());
  std::sort(sorted.begin(), sorted.end(), CompareSortKeys<T>);
  return sorted;
}